

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_BigSphere.cpp
# Opt level: O2

bool __thiscall
sch::STP_BigSphere::isHereFirstNeighbourPrime(STP_BigSphere *this,Vector3 *v,int idp)

{
  int *piVar1;
  double dVar2;
  
  if (((this->m_VVR0).m_outerSTP == idp) ||
     (dVar2 = CD_Matrix::Vector3T<double,false>::operator*(&(this->m_VVR0).m_axis,v), 0.0 <= dVar2))
  {
    if (((this->m_VVR1).m_outerSTP == idp) ||
       (dVar2 = CD_Matrix::Vector3T<double,false>::operator*(&(this->m_VVR1).m_axis,v), 0.0 <= dVar2
       )) {
      if ((this->m_VVR2).m_outerSTP == idp) {
        return true;
      }
      dVar2 = CD_Matrix::Vector3T<double,false>::operator*(&(this->m_VVR2).m_axis,v);
      if (0.0 <= dVar2) {
        return true;
      }
      piVar1 = &(this->m_VVR2).m_outerSTP;
    }
    else {
      piVar1 = &(this->m_VVR1).m_outerSTP;
    }
  }
  else {
    piVar1 = &(this->m_VVR0).m_outerSTP;
  }
  (this->super_STP_Feature).m_nextBVPrime = *piVar1;
  return false;
}

Assistant:

bool STP_BigSphere::isHereFirstNeighbourPrime(const Vector3 & v, int idp)
{
  //	std::cout << "test is here big sphere" << std::endl;
  if((m_VVR0.m_outerSTP != idp) && (m_VVR0.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR0.m_outerSTP;
    return false;
  }
  if((m_VVR1.m_outerSTP != idp) && (m_VVR1.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR1.m_outerSTP;
    return false;
  }
  if((m_VVR2.m_outerSTP != idp) && (m_VVR2.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR2.m_outerSTP;
    return false;
  }
  return true;
}